

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

str __thiscall pybind11::str::format<pybind11::handle&>(str *this,handle *args)

{
  str_attr_accessor local_48;
  object local_28 [2];
  handle *args_local;
  str *this_local;
  
  args_local = args;
  this_local = this;
  pybind11::detail::object_api<pybind11::handle>::attr
            (&local_48,(object_api<pybind11::handle> *)args,"format");
  pybind11::detail::
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
            ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              *)local_28,(handle *)&local_48);
  str(this,local_28);
  object::~object(local_28);
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_48);
  return (object)(object)this;
}

Assistant:

str format(Args &&...args) const {
        return attr("format")(std::forward<Args>(args)...);
    }